

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  Q;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  P;
  Vector3d tRes_eig;
  Vector3d tRes_FA3Ri;
  Vector3d tRes_FA3Rd;
  Matrix3d rRes_FA3Rd;
  Matrix3d rRes_FA3Ri;
  Matrix3d rRes_eig;
  random_device rd;
  
  std::random_device::random_device(&rd);
  P.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Q.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  P.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  P.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Q.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Q.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = 1000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    randomMatrix((MatrixXd *)&rRes_FA3Rd,3,1,&rd);
    randomMatrix((MatrixXd *)&rRes_FA3Ri,3,1,&rd);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&rRes_eig,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&rRes_FA3Rd);
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&P,(Matrix<double,_3,_1,_0,_3,_1> *)&rRes_eig);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&rRes_eig,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&rRes_FA3Ri);
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&Q,(Matrix<double,_3,_1,_0,_3,_1> *)&rRes_eig);
    free((void *)rRes_FA3Ri.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0]);
    free((void *)rRes_FA3Rd.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0]);
  }
  FA3R_double(&P,&Q,(Matrix3d *)0x0,0x14,&rRes_FA3Rd,&tRes_FA3Rd);
  FA3R_int(&P,&Q,(Matrix3d *)0x0,0x14,&rRes_FA3Ri,&tRes_FA3Ri);
  eig3D_eig(&P,&Q,(Matrix3d *)0x0,&rRes_eig,&tRes_eig);
  poVar1 = std::operator<<((ostream *)&std::cout,"FA3R double:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&rRes_FA3Rd)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"t: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tRes_FA3Rd)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"FA3R int:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&rRes_FA3Ri)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"t: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tRes_FA3Ri)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eig:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&rRes_eig);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"t: ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tRes_eig);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&Q.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&P.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  std::random_device::~random_device(&rd);
  return 0;
}

Assistant:

int main()
{
	std::random_device rd;
	const int len = 1000;

	std::vector<Eigen::Vector3d> P, Q;
	for(int i = 0; i < len; ++i)
    {
	    auto P_ = randomMatrix(3, 1, &rd);
        auto Q_ = randomMatrix(3, 1, &rd);
        P.push_back(P_);
        Q.push_back(Q_);
    }

	Eigen::Matrix3d rRes_FA3Rd, rRes_FA3Ri, rRes_eig;
    Eigen::Vector3d tRes_FA3Rd, tRes_FA3Ri, tRes_eig;
    FA3R_double(&P, &Q, nullptr, 20, &rRes_FA3Rd, &tRes_FA3Rd);
    FA3R_int(&P, &Q, nullptr, 20, &rRes_FA3Ri, &tRes_FA3Ri);
    eig3D_eig(&P, &Q, nullptr, &rRes_eig, &tRes_eig);

    std::cout << "FA3R double:" << std::endl;
    std::cout << "R: " << rRes_FA3Rd << std::endl;
    std::cout << "t: " << tRes_FA3Rd << std::endl;
    std::cout << std::endl;
    std::cout << std::endl;

    std::cout << "FA3R int:" << std::endl;
    std::cout << "R: " << rRes_FA3Ri << std::endl;
    std::cout << "t: " << tRes_FA3Ri << std::endl;
    std::cout << std::endl;
    std::cout << std::endl;

    std::cout << "Eig:" << std::endl;
    std::cout << "R: " << rRes_eig << std::endl;
    std::cout << "t: " << tRes_eig << std::endl;

    return 0;
}